

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  string *psVar1;
  void **ppvVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pcVar5;
  LogMessageFatal local_30 [16];
  
  psVar1 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(start,0,"start >= 0");
  if (psVar1 == (string *)0x0) {
    psVar1 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(num,0,"num >= 0");
    if (psVar1 == (string *)0x0) {
      psVar1 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                         (num + start,(this->super_RepeatedPtrFieldBase).current_size_,
                          "start + num <= size()");
      if (psVar1 == (string *)0x0) {
        if (0 < num) {
          if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0)
          {
            ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
            memcpy(elements,ppvVar2 + start,(ulong)(uint)num << 3);
          }
          google::protobuf::internal::RepeatedPtrFieldBase::CloseGap((int)this,start);
          return;
        }
        return;
      }
      pcVar5 = (psVar1->_M_dataplus)._M_p;
      sVar3 = psVar1->_M_string_length;
      uVar4 = 0x5b1;
    }
    else {
      pcVar5 = (psVar1->_M_dataplus)._M_p;
      sVar3 = psVar1->_M_string_length;
      uVar4 = 0x5b0;
    }
  }
  else {
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    uVar4 = 0x5af;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,uVar4,sVar3,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      memcpy(elements, data() + start, num * sizeof(Element*));
    }
    CloseGap(start, num);
  }
}